

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O0

void __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::BindStaticResources
          (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this,
          SHADER_TYPE ShaderStages,IResourceMapping *pResourceMapping,
          BIND_SHADER_RESOURCES_FLAGS Flags)

{
  PIPELINE_TYPE PipelineType_00;
  uint uVar1;
  Uint32 UVar2;
  SHADER_TYPE SVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  Char *Message;
  SHADER_TYPE ShaderType;
  undefined1 local_50 [8];
  string msg;
  int VarMngrInd;
  Uint32 ShaderInd;
  PIPELINE_TYPE PipelineType;
  BIND_SHADER_RESOURCES_FLAGS Flags_local;
  IResourceMapping *pResourceMapping_local;
  SHADER_TYPE ShaderStages_local;
  PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this_local;
  
  PipelineType_00 = GetPipelineType(this);
  for (msg.field_2._12_4_ = 0; uVar4 = (ulong)(uint)msg.field_2._12_4_,
      sVar5 = std::array<signed_char,_6UL>::size(&this->m_StaticResStageIndex), uVar4 < sVar5;
      msg.field_2._12_4_ = msg.field_2._12_4_ + 1) {
    pvVar6 = std::array<signed_char,_6UL>::operator[]
                       (&this->m_StaticResStageIndex,(ulong)(uint)msg.field_2._12_4_);
    uVar1 = (uint)*pvVar6;
    msg.field_2._8_4_ = uVar1;
    if (-1 < (int)uVar1) {
      UVar2 = GetNumStaticResStages(this);
      if (UVar2 <= uVar1) {
        FormatString<char[26],char[58]>
                  ((string *)local_50,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"static_cast<Uint32>(VarMngrInd) < GetNumStaticResStages()",
                   (char (*) [58])(ulong)UVar2);
        Message = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (Message,"BindStaticResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                   ,0x200);
        std::__cxx11::string::~string((string *)local_50);
      }
      SVar3 = GetShaderTypeFromPipelineIndex(msg.field_2._12_4_,PipelineType_00);
      SVar3 = Diligent::operator&(ShaderStages,SVar3);
      if (SVar3 != SHADER_TYPE_UNKNOWN) {
        ShaderVariableManagerVk::BindResources
                  (this->m_StaticVarsMgrs + (int)msg.field_2._8_4_,pResourceMapping,Flags);
      }
    }
  }
  return;
}

Assistant:

BindStaticResources(SHADER_TYPE                 ShaderStages,
                                                        IResourceMapping*           pResourceMapping,
                                                        BIND_SHADER_RESOURCES_FLAGS Flags) override final
    {
        const PIPELINE_TYPE PipelineType = GetPipelineType();
        for (Uint32 ShaderInd = 0; ShaderInd < m_StaticResStageIndex.size(); ++ShaderInd)
        {
            const int VarMngrInd = m_StaticResStageIndex[ShaderInd];
            if (VarMngrInd >= 0)
            {
                VERIFY_EXPR(static_cast<Uint32>(VarMngrInd) < GetNumStaticResStages());
                // ShaderInd is the shader type pipeline index here
                const SHADER_TYPE ShaderType = GetShaderTypeFromPipelineIndex(ShaderInd, PipelineType);
                if (ShaderStages & ShaderType)
                {
                    m_StaticVarsMgrs[VarMngrInd].BindResources(pResourceMapping, Flags);
                }
            }
        }
    }